

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_35::InMemoryFile::write(InMemoryFile *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  ssize_t in_RAX;
  long lVar2;
  ssize_t extraout_RAX;
  ulong capacity;
  undefined4 in_register_00000034;
  ulong uVar3;
  Fault f;
  Fault local_38;
  
  uVar3 = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
    _::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
    lVar2 = (*(code *)**(undefined8 **)(this->impl).value.clock)();
    (this->impl).value.lastModified.value.value = lVar2;
    capacity = __n + uVar3;
    if (CARRY8(__n,uVar3)) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x346,FAILED,"end >= offset","\"write() request overflows uint64\"",
                 (char (*) [33])"write() request overflows uint64");
      _::Debug::Fault::fatal(&local_38);
    }
    Impl::ensureCapacity(&(this->impl).value,capacity);
    uVar1 = (this->impl).value.size;
    if (capacity < uVar1) {
      capacity = uVar1;
    }
    (this->impl).value.size = capacity;
    memcpy((this->impl).value.bytes.ptr + uVar3,__buf,__n);
    _::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE);
    in_RAX = extraout_RAX;
  }
  return in_RAX;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const override {
    if (data.size() == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + data.size();
    KJ_REQUIRE(end >= offset, "write() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memcpy(lock->bytes.begin() + offset, data.begin(), data.size());
  }